

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_Examples_Test::TestBody(PrintfTest_Examples_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  AssertionResult *pAVar3;
  AssertHelper *this_00;
  string gtest_output;
  OutputRedirect gtest_redir;
  string gtest_expected_output;
  AssertionResult gtest_ar;
  int day;
  char *month;
  char *weekday;
  OutputRedirect *in_stack_00000f38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  OutputRedirect *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  int line;
  AssertionResult *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  Type type;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined7 in_stack_ffffffffffffff48;
  char **in_stack_ffffffffffffff50;
  char **in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar4;
  string local_98 [16];
  Message *in_stack_ffffffffffffff78;
  AssertHelper *in_stack_ffffffffffffff80;
  allocator local_61;
  string local_60 [48];
  AssertionResult local_30;
  undefined4 local_1c;
  char *local_18;
  char *local_10;
  
  line = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_10 = "Thursday";
  local_18 = "August";
  local_1c = 0x15;
  testing::AssertionSuccess();
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if ((bool)uVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"Thursday, 21 August",&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    OutputRedirect::OutputRedirect
              ((OutputRedirect *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               (FILE *)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff37 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffff37) {
      fmt::v5::printf<char[16],char_const*,char_const*,int>
                ((char (*) [16])CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 (int *)CONCAT17(uVar1,in_stack_ffffffffffffff48));
    }
    OutputRedirect::restore_and_read_abi_cxx11_(in_stack_00000f38);
    bVar2 = std::operator!=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if (bVar2) {
      in_stack_ffffffffffffff28 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           testing::AssertionResult::operator<<
                     ((AssertionResult *)
                      CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                      (char (*) [80])in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff20 =
           testing::AssertionResult::operator<<
                     ((AssertionResult *)
                      CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                      (char (*) [11])in_stack_ffffffffffffff28);
      pAVar3 = testing::AssertionResult::operator<<
                         ((AssertionResult *)
                          CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff28);
      line = (int)((ulong)pAVar3 >> 0x20);
      in_stack_ffffffffffffff10 =
           (OutputRedirect *)
           testing::AssertionResult::operator<<
                     ((AssertionResult *)
                      CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                      (char (*) [2])in_stack_ffffffffffffff28);
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                 (char (*) [11])in_stack_ffffffffffffff28);
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      iVar4 = 2;
    }
    else {
      iVar4 = 0;
    }
    std::__cxx11::string::~string(local_98);
    OutputRedirect::~OutputRedirect(in_stack_ffffffffffffff10);
    std::__cxx11::string::~string(local_60);
    if (iVar4 == 0) goto LAB_00137b58;
  }
  type = (Type)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x137ac8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),type,
             &in_stack_ffffffffffffff20->success_,line,(char *)in_stack_ffffffffffffff10);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::Message::~Message((Message *)0x137b16);
LAB_00137b58:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x137b65);
  return;
}

Assistant:

TEST(PrintfTest, Examples) {
  const char *weekday = "Thursday";
  const char *month = "August";
  int day = 21;
  EXPECT_WRITE(stdout, fmt::printf("%1$s, %3$d %2$s", weekday, month, day),
               "Thursday, 21 August");
}